

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorUtils-inl.hpp
# Opt level: O3

Result * CoreML::validateSchemaTypes
                   (Result *__return_storage_ptr__,
                   vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                   *allowedFeatureTypes,FeatureDescription *featureDesc)

{
  pointer pTVar1;
  string *psVar2;
  pointer pcVar3;
  char cVar4;
  Result *pRVar5;
  bool bVar6;
  pointer pTVar7;
  size_t sVar8;
  FeatureType *pFVar9;
  char *pcVar10;
  TypeCase *t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  stringstream out;
  string local_1e0;
  Result *local_1c0;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  pFVar9 = featureDesc->type_;
  if (pFVar9 == (FeatureType *)0x0) {
    pFVar9 = (FeatureType *)&Specification::_FeatureType_default_instance_;
  }
  pTVar7 = (allowedFeatureTypes->
           super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (allowedFeatureTypes->
           super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pTVar7 != pTVar1) {
    do {
      if (pFVar9->_oneof_case_[0] == *pTVar7) {
        Result::Result(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      pTVar7 = pTVar7 + 1;
    } while (pTVar7 != pTVar1);
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Unsupported type \"",0x12);
  pFVar9 = featureDesc->type_;
  if (pFVar9 == (FeatureType *)0x0) {
    pFVar9 = (FeatureType *)&Specification::_FeatureType_default_instance_;
  }
  if ((ulong)pFVar9->_oneof_case_[0] < 8) {
    pcVar10 = (&PTR_anon_var_dwarf_5a620c_00708e00)[pFVar9->_oneof_case_[0]];
  }
  else {
    pcVar10 = "INVALID";
  }
  sVar8 = strlen(pcVar10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,sVar8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\" for feature \"",0xf);
  psVar2 = (featureDesc->name_).ptr_;
  pcVar3 = (psVar2->_M_dataplus)._M_p;
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,pcVar3,pcVar3 + psVar2->_M_string_length);
  std::__cxx11::string::append((char *)&local_1e0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  local_1c0 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  pTVar7 = (allowedFeatureTypes->
           super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (allowedFeatureTypes->
           super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pTVar7 != pTVar1) {
    bVar6 = true;
    do {
      if (!bVar6) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      }
      pcVar10 = "INVALID";
      if ((ulong)*pTVar7 < 8) {
        pcVar10 = (&PTR_anon_var_dwarf_5a620c_00708e00)[*pTVar7];
      }
      sVar8 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,sVar8);
      pTVar7 = pTVar7 + 1;
      bVar6 = false;
    } while (pTVar7 != pTVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".",1);
  cVar4 = (char)(ostream *)local_1a8;
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  pRVar5 = local_1c0;
  Result::Result(local_1c0,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return pRVar5;
}

Assistant:

inline Result validateSchemaTypes(const std::vector<Specification::FeatureType::TypeCase>& allowedFeatureTypes,
                 const Specification::FeatureDescription& featureDesc) {
        
        // Check the types
        auto type = featureDesc.type().Type_case();
        for (const auto& t : allowedFeatureTypes) {
            if (type == t) {
                // no invariant broken -- type matches one of the allowed types
                return Result();
            }
        }
        
        // Invalid type
        std::stringstream out;
        out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(featureDesc.type().Type_case()))
        << "\" for feature \"" << featureDesc.name() + "\". Should be one of: ";
        bool isFirst = true;
        for (const auto& t: allowedFeatureTypes) {
            if (!isFirst) {
                out << ", ";
            }
            out << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(t));
            isFirst = false;
        }
        out << "." << std::endl;
        return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE, out.str());
    }